

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpivotgrowth.c
# Opt level: O2

double zPivotGrowth(int ncols,SuperMatrix *A,int *perm_c,SuperMatrix *L,SuperMatrix *U)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  void *addr;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  doublecomplex *pdVar15;
  long lVar16;
  double dVar17;
  double local_a8;
  double local_90;
  double local_88;
  
  local_90 = dmach("S");
  pvVar3 = A->Store;
  pvVar4 = L->Store;
  pvVar5 = U->Store;
  lVar6 = *(long *)((long)pvVar3 + 8);
  lVar7 = *(long *)((long)pvVar4 + 8);
  lVar8 = *(long *)((long)pvVar5 + 8);
  addr = superlu_malloc((long)A->ncol << 2);
  for (lVar9 = 0; lVar9 < A->ncol; lVar9 = lVar9 + 1) {
    *(int *)((long)addr + (long)perm_c[lVar9] * 4) = (int)lVar9;
  }
  local_90 = 1.0 / local_90;
  lVar9 = 0;
  do {
    if (*(int *)((long)pvVar4 + 4) < lVar9) break;
    lVar14 = *(long *)((long)pvVar4 + 0x30);
    lVar12 = (long)*(int *)(lVar14 + lVar9 * 4);
    iVar1 = *(int *)(*(long *)((long)pvVar4 + 0x20) + 4 + lVar12 * 4);
    iVar2 = *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar12 * 4);
    lVar10 = (long)*(int *)(*(long *)((long)pvVar4 + 0x10) + lVar12 * 4) * 0x10 + lVar7;
    lVar9 = lVar9 + 1;
    lVar16 = 0x10;
    while ((lVar12 < ncols && (lVar12 < *(int *)(lVar14 + lVar9 * 4)))) {
      lVar13 = (long)*(int *)((long)addr + lVar12 * 4);
      lVar14 = *(long *)((long)pvVar3 + 0x18);
      lVar11 = (long)*(int *)(lVar14 + lVar13 * 4);
      pdVar15 = (doublecomplex *)(lVar11 * 0x10 + lVar6);
      local_88 = 0.0;
      for (; lVar11 < *(int *)(lVar14 + 4 + lVar13 * 4); lVar11 = lVar11 + 1) {
        dVar17 = z_abs1(pdVar15);
        if (local_88 <= dVar17) {
          local_88 = z_abs1(pdVar15);
        }
        lVar14 = *(long *)((long)pvVar3 + 0x18);
        pdVar15 = pdVar15 + 1;
      }
      lVar14 = *(long *)((long)pvVar5 + 0x18);
      lVar11 = (long)*(int *)(lVar14 + lVar12 * 4);
      lVar12 = lVar12 + 1;
      pdVar15 = (doublecomplex *)(lVar11 * 0x10 + lVar8);
      local_a8 = 0.0;
      for (; lVar11 < *(int *)(lVar14 + lVar12 * 4); lVar11 = lVar11 + 1) {
        dVar17 = z_abs1(pdVar15);
        if (local_a8 <= dVar17) {
          local_a8 = z_abs1(pdVar15);
        }
        lVar14 = *(long *)((long)pvVar5 + 0x18);
        pdVar15 = pdVar15 + 1;
      }
      for (lVar14 = 0; lVar16 != lVar14; lVar14 = lVar14 + 0x10) {
        dVar17 = z_abs1((doublecomplex *)(lVar10 + lVar14));
        if (local_a8 <= dVar17) {
          local_a8 = z_abs1((doublecomplex *)(lVar10 + lVar14));
        }
      }
      dVar17 = (double)(-(ulong)(local_a8 == 0.0) & 0x3ff0000000000000 |
                       ~-(ulong)(local_a8 == 0.0) & (ulong)(local_88 / local_a8));
      if (dVar17 <= local_90) {
        local_90 = dVar17;
      }
      lVar16 = lVar16 + 0x10;
      lVar10 = lVar10 + (long)iVar1 * 0x10 + (long)iVar2 * -0x10;
      lVar14 = *(long *)((long)pvVar4 + 0x30);
    }
  } while (lVar12 < ncols);
  superlu_free(addr);
  return local_90;
}

Assistant:

double
zPivotGrowth(int ncols, SuperMatrix *A, int *perm_c, 
             SuperMatrix *L, SuperMatrix *U)
{

    NCformat *Astore;
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex  *Aval, *Lval, *Uval;
    int      fsupc, nsupr;
    int_t    luptr, nz_in_U;
    int_t    i, j, k, oldcol;
    int      *inv_perm_c;
    double   rpg, maxaj, maxuj;
    double   smlnum;
    doublecomplex   *luval;
   
    /* Get machine constants. */
    smlnum = dmach("S");
    rpg = 1. / smlnum;

    Astore = A->Store;
    Lstore = L->Store;
    Ustore = U->Store;
    Aval = Astore->nzval;
    Lval = Lstore->nzval;
    Uval = Ustore->nzval;
    
    inv_perm_c = (int *) SUPERLU_MALLOC(A->ncol*sizeof(int));
    for (j = 0; j < A->ncol; ++j) inv_perm_c[perm_c[j]] = j;

    for (k = 0; k <= Lstore->nsuper; ++k) {
	fsupc = L_FST_SUPC(k);
	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	luptr = L_NZ_START(fsupc);
	luval = &Lval[luptr];
	nz_in_U = 1;
	
	for (j = fsupc; j < L_FST_SUPC(k+1) && j < ncols; ++j) {
	    maxaj = 0.;
            oldcol = inv_perm_c[j];
	    for (i = Astore->colptr[oldcol]; i < Astore->colptr[oldcol+1]; ++i)
		maxaj = SUPERLU_MAX( maxaj, z_abs1( &Aval[i]) );
	
	    maxuj = 0.;
	    for (i = Ustore->colptr[j]; i < Ustore->colptr[j+1]; i++)
		maxuj = SUPERLU_MAX( maxuj, z_abs1( &Uval[i]) );
	    
	    /* Supernode */
	    for (i = 0; i < nz_in_U; ++i)
		maxuj = SUPERLU_MAX( maxuj, z_abs1( &luval[i]) );

	    ++nz_in_U;
	    luval += nsupr;

	    if ( maxuj == 0. )
		rpg = SUPERLU_MIN( rpg, 1.);
	    else
		rpg = SUPERLU_MIN( rpg, maxaj / maxuj );
	}
	
	if ( j >= ncols ) break;
    }

    SUPERLU_FREE(inv_perm_c);
    return (rpg);
}